

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O1

void Abc_NtkPrintPoEquivs(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar2;
  int iVar3;
  uint uVar4;
  void *__s;
  Vec_Ptr_t *pVVar5;
  Abc_Obj_t *pAVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  
  iVar1 = pNtk->vObjs->nSize;
  iVar3 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar3 = iVar1;
  }
  if (iVar3 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar3 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0xff,(long)iVar1 * 4);
  }
  pVVar5 = pNtk->vPos;
  if (0 < pVVar5->nSize) {
    lVar12 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar5->pArray[lVar12];
      pAVar2 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
      if (pNtk->ntkType == ABC_NTK_STRASH) {
        pAVar6 = Abc_AigConst1(pNtk);
        if (pAVar2 != pAVar6) goto LAB_002f09d9;
        pcVar7 = Abc_ObjName(pObj);
        uVar10 = (ulong)((*(uint *)&pObj->field_0x14 >> 10 & 1) == 0);
LAB_002f0abb:
        printf("%s = Const%d\n",pcVar7,uVar10);
      }
      else {
LAB_002f09d9:
        if (pNtk->ntkType != ABC_NTK_STRASH) {
          iVar3 = Abc_NodeIsConst(pAVar2);
          if (iVar3 != 0) {
            pcVar7 = Abc_ObjName(pObj);
            uVar4 = Abc_NodeIsConst1(pAVar2);
            uVar10 = (ulong)uVar4;
            goto LAB_002f0abb;
          }
        }
        lVar8 = (long)pAVar2->Id;
        if ((lVar8 < 0) || (iVar1 <= pAVar2->Id)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar4 = *(uint *)((long)__s + lVar8 * 4);
        if ((ulong)uVar4 == 0xffffffff) {
          *(int *)((long)__s + lVar8 * 4) = (int)lVar12;
        }
        else {
          if (((int)uVar4 < 0) || (pNtk->vCos->nSize <= (int)uVar4)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pAVar2 = (Abc_Obj_t *)pNtk->vCos->pArray[uVar4];
          pcVar7 = Abc_ObjName(pObj);
          pcVar11 = "!";
          if (((*(uint *)&pObj->field_0x14 ^ *(uint *)&pAVar2->field_0x14) >> 10 & 1) == 0) {
            pcVar11 = "";
          }
          pcVar9 = Abc_ObjName(pAVar2);
          printf("%s = %s%s\n",pcVar7,pcVar11,pcVar9);
        }
      }
      lVar12 = lVar12 + 1;
      pVVar5 = pNtk->vPos;
    } while (lVar12 < pVVar5->nSize);
  }
  if (__s != (void *)0x0) {
    free(__s);
    return;
  }
  return;
}

Assistant:

void Abc_NtkPrintPoEquivs( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pDriver, * pRepr;  int i, iRepr;
    Vec_Int_t * vMap = Vec_IntStartFull( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        pDriver = Abc_ObjFanin0(pObj);
        if ( Abc_NtkIsStrash(pNtk) && pDriver == Abc_AigConst1(pNtk) )
        {
            printf( "%s = Const%d\n", Abc_ObjName(pObj), !Abc_ObjFaninC0(pObj) );
            continue;
        }
        else if ( !Abc_NtkIsStrash(pNtk) && Abc_NodeIsConst(pDriver) )
        {
            printf( "%s = Const%d\n", Abc_ObjName(pObj), Abc_NodeIsConst1(pDriver) );
            continue;
        }
        iRepr = Vec_IntEntry( vMap, Abc_ObjId(pDriver) );
        if ( iRepr == -1 )
        {
            Vec_IntWriteEntry( vMap, Abc_ObjId(pDriver), i );
            continue;
        }
        pRepr = Abc_NtkCo(pNtk, iRepr);
        printf( "%s = %s%s\n", Abc_ObjName(pObj), Abc_ObjFaninC0(pRepr) == Abc_ObjFaninC0(pObj) ? "" : "!", Abc_ObjName(pRepr) );
    }
    Vec_IntFree( vMap );
}